

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_3cd9::test_of_ptr(void **param_1)

{
  roaring64_bitmap_t *r_00;
  iterator __last;
  size_type result;
  roaring64_bitmap_t *this;
  uint64_t i;
  roaring64_bitmap_t *r;
  array<unsigned_long,_1000UL> vals;
  undefined4 in_stack_ffffffffffffe088;
  int in_stack_ffffffffffffe08c;
  roaring64_bitmap_t *in_stack_ffffffffffffe090;
  roaring64_bitmap_t *file;
  ulong local_1f58;
  roaring64_bitmap_t *in_stack_ffffffffffffe110;
  
  r_00 = (roaring64_bitmap_t *)
         std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x102c69);
  __last = std::array<unsigned_long,_1000UL>::end((array<unsigned_long,_1000UL> *)0x102c78);
  std::iota<unsigned_long*,int>((unsigned_long *)r_00,__last,0);
  result = std::array<unsigned_long,_1000UL>::size
                     ((array<unsigned_long,_1000UL> *)&stack0xffffffffffffe0b8);
  std::array<unsigned_long,_1000UL>::data((array<unsigned_long,_1000UL> *)0x102ca0);
  this = roaring64_bitmap_of_ptr
                   ((size_t)in_stack_ffffffffffffe090,
                    (uint64_t *)CONCAT44(in_stack_ffffffffffffe08c,in_stack_ffffffffffffe088));
  assert_r64_valid(in_stack_ffffffffffffe090);
  for (local_1f58 = 0; local_1f58 < 1000; local_1f58 = local_1f58 + 1) {
    file = this;
    std::array<unsigned_long,_1000UL>::operator[]
              ((array<unsigned_long,_1000UL> *)this,
               CONCAT44(in_stack_ffffffffffffe08c,in_stack_ffffffffffffe088));
    roaring64_bitmap_contains(r_00,(uint64_t)file);
    _assert_true(result,(char *)r_00,(char *)file,in_stack_ffffffffffffe08c);
  }
  roaring64_bitmap_free(in_stack_ffffffffffffe110);
  return;
}

Assistant:

DEFINE_TEST(test_of_ptr) {
    std::array<uint64_t, 1000> vals;
    std::iota(vals.begin(), vals.end(), 0);
    roaring64_bitmap_t* r = roaring64_bitmap_of_ptr(vals.size(), vals.data());
    assert_r64_valid(r);
    for (uint64_t i = 0; i < 1000; ++i) {
        assert_true(roaring64_bitmap_contains(r, vals[i]));
    }
    roaring64_bitmap_free(r);
}